

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

void __thiscall ctemplate::TemplateCache::~TemplateCache(TemplateCache *this)

{
  _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  _Hashtable<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  pthread_rwlock_t *ppVar1;
  int iVar2;
  
  ClearCache(this);
  this_00 = &this->parsed_template_cache_->_M_h;
  if (this_00 !=
      (_Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    std::
    _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(this_00);
  }
  operator_delete(this_00);
  this_01 = &this->get_template_calls_->_M_h;
  if (this_01 !=
      (_Hashtable<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    std::
    _Hashtable<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(this_01);
  }
  operator_delete(this_01);
  ppVar1 = (pthread_rwlock_t *)this->mutex_;
  if (((ppVar1 != (pthread_rwlock_t *)0x0) && (*(char *)((long)ppVar1 + 0x39) == '\x01')) &&
     (ppVar1[1].__size[0] == '\x01')) {
    iVar2 = pthread_rwlock_destroy(ppVar1);
    if (iVar2 != 0) goto LAB_00120fd4;
  }
  operator_delete(ppVar1);
  ppVar1 = (pthread_rwlock_t *)this->search_path_mutex_;
  if (((ppVar1 != (pthread_rwlock_t *)0x0) && (*(char *)((long)ppVar1 + 0x39) == '\x01')) &&
     (ppVar1[1].__size[0] == '\x01')) {
    iVar2 = pthread_rwlock_destroy(ppVar1);
    if (iVar2 != 0) {
LAB_00120fd4:
      abort();
    }
  }
  operator_delete(ppVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->search_path_);
  return;
}

Assistant:

TemplateCache::~TemplateCache() {
  ClearCache();
  delete parsed_template_cache_;
  delete get_template_calls_;
  delete mutex_;
  delete search_path_mutex_;
}